

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

void __thiscall nvim::Nvim::async_win_get_buf(Nvim *this,Window window)

{
  allocator local_41;
  Window local_40;
  string local_38;
  
  local_40 = window;
  std::__cxx11::string::string((string *)&local_38,"nvim_win_get_buf",&local_41);
  NvimRPC::async_call<long>(&this->client_,&local_38,&local_40);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Nvim::async_win_get_buf(Window window) {
    client_.async_call("nvim_win_get_buf", window);
}